

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O3

void __thiscall HEkkDual::initialiseInstanceParallel(HEkkDual *this,HEkk *simplex)

{
  _Rb_tree_header *p_Var1;
  HEkk *pHVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint initial_num_slice;
  uint uVar6;
  HVectorBase<double> *this_00;
  HEkkDualRow local_180;
  
  pHVar2 = this->ekk_instance_;
  iVar3 = (pHVar2->info_).simplex_strategy;
  if (iVar3 == 1) {
    return;
  }
  iVar4 = (pHVar2->info_).num_concurrency;
  if (iVar3 == 2) {
    initial_num_slice = iVar4 - 2;
    if (iVar4 < 3) {
      highsLogDev(&(pHVar2->options_->super_HighsOptionsStruct).log_options,kWarning,
                  "SIP trying to use using %d slices due to concurrency (%d) being too small: results unpredictable\n"
                  ,(ulong)initial_num_slice);
      goto LAB_0034a578;
    }
  }
  else {
    iVar3 = 1;
    if (1 < iVar4) {
      iVar3 = iVar4;
    }
    iVar4 = 8;
    if (iVar3 < 8) {
      iVar4 = iVar3;
    }
    this->multi_num = iVar4;
    this_00 = &this->multi_choice[0].col_BFRT;
    lVar5 = 0;
    do {
      *(undefined4 *)&this_00[-3].packFlag = 0xffffffff;
      HVectorBase<double>::setup(this_00 + -2,this->solver_num_row);
      HVectorBase<double>::setup(this_00 + -1,this->solver_num_row);
      HVectorBase<double>::setup(this_00,this->solver_num_row);
      lVar5 = lVar5 + 1;
      iVar3 = this->multi_num;
      this_00 = (HVectorBase<double> *)&this_00[3].synthetic_tick;
    } while (lVar5 < iVar3);
    iVar4 = 2;
    if (2 < iVar3) {
      iVar4 = iVar3;
    }
    initial_num_slice = iVar4 - 1;
  }
  p_Var1 = &local_180.freeList._M_t._M_impl.super__Rb_tree_header;
  uVar6 = initial_num_slice;
  do {
    local_180.workSize = -1;
    local_180.freeList._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_180.freeList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_180.work_devex_index = (HighsInt *)0x0;
    local_180.workDual = (double *)0x0;
    local_180.workRange = (double *)0x0;
    local_180.workNumTotPermutation = (HighsInt *)0x0;
    local_180.workMove = (int8_t *)0x0;
    local_180.freeList._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_180.packCount = 0;
    local_180.ekk_instance_ = simplex;
    local_180.freeList._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_180.freeList._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    memset(&local_180.packIndex,0,0x8c);
    local_180.original_workData.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_180.original_workData.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_180.original_workData.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_180.sorted_workData.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_180.sorted_workData.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_180.sorted_workData.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_180.alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_180.alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_180.alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_180.analysis = (HighsSimplexAnalysis *)0x0;
    std::vector<HEkkDualRow,_std::allocator<HEkkDualRow>_>::emplace_back<HEkkDualRow>
              (&this->slice_dualRow,&local_180);
    HEkkDualRow::~HEkkDualRow(&local_180);
    uVar6 = uVar6 - 1;
  } while (uVar6 != 0);
LAB_0034a578:
  initSlice(this,initial_num_slice);
  this->multi_iteration = 0;
  return;
}

Assistant:

void HEkkDual::initialiseInstanceParallel(HEkk& simplex) {
  // No need to call this with kSimplexStrategyDualPlain
  if (ekk_instance_.info_.simplex_strategy == kSimplexStrategyDualPlain) return;

  // Identify the (current) number of HiGHS tasks to be used
  const HighsInt num_concurrency = ekk_instance_.info_.num_concurrency;

  HighsInt pass_num_slice;
  if (ekk_instance_.info_.simplex_strategy == kSimplexStrategyDualTasks) {
    // Initialize for tasks
    pass_num_slice = num_concurrency - 2;
    assert(pass_num_slice > 0);
    if (pass_num_slice <= 0) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                  "SIP trying to use using %" HIGHSINT_FORMAT
                  " slices due to concurrency (%" HIGHSINT_FORMAT
                  ") being too small: results unpredictable\n",
                  pass_num_slice, num_concurrency);
    }
  } else {
    // Initialize for multi
    multi_num = num_concurrency;
    if (multi_num < 1) multi_num = 1;
    if (multi_num > kSimplexConcurrencyLimit)
      multi_num = kSimplexConcurrencyLimit;
    for (HighsInt i = 0; i < multi_num; i++) {
      multi_choice[i].row_out = -1;
      multi_choice[i].row_ep.setup(solver_num_row);
      multi_choice[i].col_aq.setup(solver_num_row);
      multi_choice[i].col_BFRT.setup(solver_num_row);
    }
    pass_num_slice = max(multi_num - 1, HighsInt{1});
    assert(pass_num_slice > 0);
    if (pass_num_slice <= 0) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                  "PAMI trying to use using %" HIGHSINT_FORMAT
                  " slices due to concurrency (%" HIGHSINT_FORMAT
                  ") being too small: results unpredictable\n",
                  pass_num_slice, num_concurrency);
    }
  }
  // Create the multiple HEkkDualRow instances: one for each column
  // slice
  for (HighsInt i = 0; i < pass_num_slice; i++)
    slice_dualRow.push_back(HEkkDualRow(simplex));
  // Initialise the column slices
  initSlice(pass_num_slice);
  multi_iteration = 0;
}